

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall cs::structure::structure(structure *this,structure *s)

{
  domain_t *__p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  element_type *peVar4;
  domain_type *pdVar5;
  char *pcVar6;
  proxy *ppVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [11];
  undefined1 auVar23 [11];
  undefined1 auVar24 [11];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [13];
  undefined1 auVar30 [13];
  undefined1 auVar31 [13];
  undefined1 auVar32 [13];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  size_t sVar37;
  var *pvVar38;
  var *pvVar39;
  size_t sVar40;
  uint uVar41;
  slot_type *psVar42;
  char *pcVar43;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  var p;
  any aStack_c8;
  key_arg<std::__cxx11::basic_string<char>_> local_c0;
  structure *local_a0;
  any local_98;
  any local_90;
  any local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  structure *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_70;
  string *local_68;
  structure *local_60;
  structure *local_58;
  any local_50;
  any local_48;
  structure *local_40;
  structure *local_38;
  
  this->m_shadow = false;
  local_68 = &this->m_name;
  local_80 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_80;
  pcVar3 = (s->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar3,pcVar3 + (s->m_name)._M_string_length);
  __p = &this->m_data;
  (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_70 = &(this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::domain_type,std::allocator<cs::domain_type>>
            (local_70,(domain_type **)__p,(allocator<cs::domain_type> *)&local_c0);
  sVar37 = (s->m_id).type_hash;
  (this->m_id).type_idx._M_target = (s->m_id).type_idx._M_target;
  (this->m_id).type_hash = sVar37;
  peVar4 = (s->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_60 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"parent","");
  sVar37 = phmap::priv::
           raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
           ::count<std::__cxx11::string>
                     ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                       *)peVar4,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_a0 = s;
  if (sVar37 != 0) {
    pdVar5 = (s->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"parent","");
    pvVar38 = domain_type::get_var(pdVar5,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_58 = cs_impl::any::val<cs::structure>(pvVar38);
    local_48.mDat = pvVar38->mDat;
    if (local_48.mDat != (proxy *)0x0) {
      (local_48.mDat)->refcount = (local_48.mDat)->refcount + 1;
    }
    copy((EVP_PKEY_CTX *)&aStack_c8,(EVP_PKEY_CTX *)&local_48);
    cs_impl::any::recycle(&local_48);
    local_78 = cs_impl::any::val<cs::structure>(&aStack_c8);
    pdVar5 = (__p->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"parent","");
    domain_type::add_var(pdVar5,&local_c0,&aStack_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    peVar4 = (local_78->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar6 = (peVar4->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
    psVar42 = (peVar4->m_reflect).
              super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              .
              super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              .slots_;
    cVar2 = *pcVar6;
    pcVar43 = pcVar6;
    while (cVar2 < -1) {
      iVar17 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar18 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar19 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar20 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar43 < (char)iVar17);
      in_XMM1_Bb = -(pcVar43[1] < (char)((uint)iVar17 >> 8));
      in_XMM1_Bc = -(pcVar43[2] < (char)((uint)iVar17 >> 0x10));
      in_XMM1_Bd = -(pcVar43[3] < (char)((uint)iVar17 >> 0x18));
      in_XMM1_Be = -(pcVar43[4] < (char)iVar18);
      in_XMM1_Bf = -(pcVar43[5] < (char)((uint)iVar18 >> 8));
      in_XMM1_Bg = -(pcVar43[6] < (char)((uint)iVar18 >> 0x10));
      in_XMM1_Bh = -(pcVar43[7] < (char)((uint)iVar18 >> 0x18));
      in_XMM1_Bi = -(pcVar43[8] < (char)iVar19);
      in_XMM1_Bj = -(pcVar43[9] < (char)((uint)iVar19 >> 8));
      in_XMM1_Bk = -(pcVar43[10] < (char)((uint)iVar19 >> 0x10));
      in_XMM1_Bl = -(pcVar43[0xb] < (char)((uint)iVar19 >> 0x18));
      in_XMM1_Bm = -(pcVar43[0xc] < (char)iVar20);
      in_XMM1_Bn = -(pcVar43[0xd] < (char)((uint)iVar20 >> 8));
      in_XMM1_Bo = -(pcVar43[0xe] < (char)((uint)iVar20 >> 0x10));
      in_XMM1_Bp = -(pcVar43[0xf] < (char)((uint)iVar20 >> 0x18));
      auVar9[1] = in_XMM1_Bb;
      auVar9[0] = in_XMM1_Ba;
      auVar9[2] = in_XMM1_Bc;
      auVar9[3] = in_XMM1_Bd;
      auVar9[4] = in_XMM1_Be;
      auVar9[5] = in_XMM1_Bf;
      auVar9[6] = in_XMM1_Bg;
      auVar9[7] = in_XMM1_Bh;
      auVar9[8] = in_XMM1_Bi;
      auVar9[9] = in_XMM1_Bj;
      auVar9[10] = in_XMM1_Bk;
      auVar9[0xb] = in_XMM1_Bl;
      auVar9[0xc] = in_XMM1_Bm;
      auVar9[0xd] = in_XMM1_Bn;
      auVar9[0xe] = in_XMM1_Bo;
      auVar9[0xf] = in_XMM1_Bp;
      auVar10[1] = in_XMM1_Bb;
      auVar10[0] = in_XMM1_Ba;
      auVar10[2] = in_XMM1_Bc;
      auVar10[3] = in_XMM1_Bd;
      auVar10[4] = in_XMM1_Be;
      auVar10[5] = in_XMM1_Bf;
      auVar10[6] = in_XMM1_Bg;
      auVar10[7] = in_XMM1_Bh;
      auVar10[8] = in_XMM1_Bi;
      auVar10[9] = in_XMM1_Bj;
      auVar10[10] = in_XMM1_Bk;
      auVar10[0xb] = in_XMM1_Bl;
      auVar10[0xc] = in_XMM1_Bm;
      auVar10[0xd] = in_XMM1_Bn;
      auVar10[0xe] = in_XMM1_Bo;
      auVar10[0xf] = in_XMM1_Bp;
      auVar33[1] = in_XMM1_Bd;
      auVar33[0] = in_XMM1_Bc;
      auVar33[2] = in_XMM1_Be;
      auVar33[3] = in_XMM1_Bf;
      auVar33[4] = in_XMM1_Bg;
      auVar33[5] = in_XMM1_Bh;
      auVar33[6] = in_XMM1_Bi;
      auVar33[7] = in_XMM1_Bj;
      auVar33[8] = in_XMM1_Bk;
      auVar33[9] = in_XMM1_Bl;
      auVar33[10] = in_XMM1_Bm;
      auVar33[0xb] = in_XMM1_Bn;
      auVar33[0xc] = in_XMM1_Bo;
      auVar33[0xd] = in_XMM1_Bp;
      auVar29[1] = in_XMM1_Be;
      auVar29[0] = in_XMM1_Bd;
      auVar29[2] = in_XMM1_Bf;
      auVar29[3] = in_XMM1_Bg;
      auVar29[4] = in_XMM1_Bh;
      auVar29[5] = in_XMM1_Bi;
      auVar29[6] = in_XMM1_Bj;
      auVar29[7] = in_XMM1_Bk;
      auVar29[8] = in_XMM1_Bl;
      auVar29[9] = in_XMM1_Bm;
      auVar29[10] = in_XMM1_Bn;
      auVar29[0xb] = in_XMM1_Bo;
      auVar29[0xc] = in_XMM1_Bp;
      auVar25[1] = in_XMM1_Bf;
      auVar25[0] = in_XMM1_Be;
      auVar25[2] = in_XMM1_Bg;
      auVar25[3] = in_XMM1_Bh;
      auVar25[4] = in_XMM1_Bi;
      auVar25[5] = in_XMM1_Bj;
      auVar25[6] = in_XMM1_Bk;
      auVar25[7] = in_XMM1_Bl;
      auVar25[8] = in_XMM1_Bm;
      auVar25[9] = in_XMM1_Bn;
      auVar25[10] = in_XMM1_Bo;
      auVar25[0xb] = in_XMM1_Bp;
      auVar21[1] = in_XMM1_Bg;
      auVar21[0] = in_XMM1_Bf;
      auVar21[2] = in_XMM1_Bh;
      auVar21[3] = in_XMM1_Bi;
      auVar21[4] = in_XMM1_Bj;
      auVar21[5] = in_XMM1_Bk;
      auVar21[6] = in_XMM1_Bl;
      auVar21[7] = in_XMM1_Bm;
      auVar21[8] = in_XMM1_Bn;
      auVar21[9] = in_XMM1_Bo;
      auVar21[10] = in_XMM1_Bp;
      uVar41 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar33 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar29 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar25 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar21 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar8 = 0;
      if (uVar41 != 0) {
        for (; (uVar41 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      psVar42 = psVar42 + uVar8;
      cVar2 = pcVar43[uVar8];
      pcVar43 = pcVar43 + uVar8;
    }
    sVar37 = (peVar4->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .capacity_;
    if (pcVar43 != pcVar6 + sVar37) {
      do {
        pvVar38 = domain_type::get_var
                            ((local_a0->m_data).
                             super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             &(psVar42->value).first);
        pvVar39 = domain_type::get_var
                            ((local_58->m_data).
                             super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             &(psVar42->value).first);
        ppVar7 = pvVar38->mDat;
        pdVar5 = (__p->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (pvVar39->mDat == ppVar7) {
          domain_type::add_var
                    (pdVar5,&(psVar42->value).first,
                     (((local_78->m_data).
                       super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl
                     .super__Vector_impl_data._M_start + (long)(&psVar42->key)[1]._M_dataplus._M_p);
        }
        else {
          if (ppVar7 != (proxy *)0x0) {
            ppVar7->refcount = ppVar7->refcount + 1;
          }
          local_88.mDat = ppVar7;
          copy((EVP_PKEY_CTX *)&local_c0,(EVP_PKEY_CTX *)&local_88);
          domain_type::add_var(pdVar5,&(psVar42->value).first,(var *)&local_c0);
          cs_impl::any::recycle((any *)&local_c0);
          cs_impl::any::recycle(&local_88);
        }
        psVar42 = (slot_type *)&(&psVar42->key)[1]._M_string_length;
        cVar2 = pcVar43[1];
        pcVar43 = pcVar43 + 1;
        while (cVar2 < -1) {
          iVar17 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                          == CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
          iVar18 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                          == CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
          iVar19 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                          == CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
          iVar20 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                          == CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
          in_XMM1_Ba = -(*pcVar43 < (char)iVar17);
          in_XMM1_Bb = -(pcVar43[1] < (char)((uint)iVar17 >> 8));
          in_XMM1_Bc = -(pcVar43[2] < (char)((uint)iVar17 >> 0x10));
          in_XMM1_Bd = -(pcVar43[3] < (char)((uint)iVar17 >> 0x18));
          in_XMM1_Be = -(pcVar43[4] < (char)iVar18);
          in_XMM1_Bf = -(pcVar43[5] < (char)((uint)iVar18 >> 8));
          in_XMM1_Bg = -(pcVar43[6] < (char)((uint)iVar18 >> 0x10));
          in_XMM1_Bh = -(pcVar43[7] < (char)((uint)iVar18 >> 0x18));
          in_XMM1_Bi = -(pcVar43[8] < (char)iVar19);
          in_XMM1_Bj = -(pcVar43[9] < (char)((uint)iVar19 >> 8));
          in_XMM1_Bk = -(pcVar43[10] < (char)((uint)iVar19 >> 0x10));
          in_XMM1_Bl = -(pcVar43[0xb] < (char)((uint)iVar19 >> 0x18));
          in_XMM1_Bm = -(pcVar43[0xc] < (char)iVar20);
          in_XMM1_Bn = -(pcVar43[0xd] < (char)((uint)iVar20 >> 8));
          in_XMM1_Bo = -(pcVar43[0xe] < (char)((uint)iVar20 >> 0x10));
          in_XMM1_Bp = -(pcVar43[0xf] < (char)((uint)iVar20 >> 0x18));
          auVar11[1] = in_XMM1_Bb;
          auVar11[0] = in_XMM1_Ba;
          auVar11[2] = in_XMM1_Bc;
          auVar11[3] = in_XMM1_Bd;
          auVar11[4] = in_XMM1_Be;
          auVar11[5] = in_XMM1_Bf;
          auVar11[6] = in_XMM1_Bg;
          auVar11[7] = in_XMM1_Bh;
          auVar11[8] = in_XMM1_Bi;
          auVar11[9] = in_XMM1_Bj;
          auVar11[10] = in_XMM1_Bk;
          auVar11[0xb] = in_XMM1_Bl;
          auVar11[0xc] = in_XMM1_Bm;
          auVar11[0xd] = in_XMM1_Bn;
          auVar11[0xe] = in_XMM1_Bo;
          auVar11[0xf] = in_XMM1_Bp;
          auVar12[1] = in_XMM1_Bb;
          auVar12[0] = in_XMM1_Ba;
          auVar12[2] = in_XMM1_Bc;
          auVar12[3] = in_XMM1_Bd;
          auVar12[4] = in_XMM1_Be;
          auVar12[5] = in_XMM1_Bf;
          auVar12[6] = in_XMM1_Bg;
          auVar12[7] = in_XMM1_Bh;
          auVar12[8] = in_XMM1_Bi;
          auVar12[9] = in_XMM1_Bj;
          auVar12[10] = in_XMM1_Bk;
          auVar12[0xb] = in_XMM1_Bl;
          auVar12[0xc] = in_XMM1_Bm;
          auVar12[0xd] = in_XMM1_Bn;
          auVar12[0xe] = in_XMM1_Bo;
          auVar12[0xf] = in_XMM1_Bp;
          auVar34[1] = in_XMM1_Bd;
          auVar34[0] = in_XMM1_Bc;
          auVar34[2] = in_XMM1_Be;
          auVar34[3] = in_XMM1_Bf;
          auVar34[4] = in_XMM1_Bg;
          auVar34[5] = in_XMM1_Bh;
          auVar34[6] = in_XMM1_Bi;
          auVar34[7] = in_XMM1_Bj;
          auVar34[8] = in_XMM1_Bk;
          auVar34[9] = in_XMM1_Bl;
          auVar34[10] = in_XMM1_Bm;
          auVar34[0xb] = in_XMM1_Bn;
          auVar34[0xc] = in_XMM1_Bo;
          auVar34[0xd] = in_XMM1_Bp;
          auVar30[1] = in_XMM1_Be;
          auVar30[0] = in_XMM1_Bd;
          auVar30[2] = in_XMM1_Bf;
          auVar30[3] = in_XMM1_Bg;
          auVar30[4] = in_XMM1_Bh;
          auVar30[5] = in_XMM1_Bi;
          auVar30[6] = in_XMM1_Bj;
          auVar30[7] = in_XMM1_Bk;
          auVar30[8] = in_XMM1_Bl;
          auVar30[9] = in_XMM1_Bm;
          auVar30[10] = in_XMM1_Bn;
          auVar30[0xb] = in_XMM1_Bo;
          auVar30[0xc] = in_XMM1_Bp;
          auVar26[1] = in_XMM1_Bf;
          auVar26[0] = in_XMM1_Be;
          auVar26[2] = in_XMM1_Bg;
          auVar26[3] = in_XMM1_Bh;
          auVar26[4] = in_XMM1_Bi;
          auVar26[5] = in_XMM1_Bj;
          auVar26[6] = in_XMM1_Bk;
          auVar26[7] = in_XMM1_Bl;
          auVar26[8] = in_XMM1_Bm;
          auVar26[9] = in_XMM1_Bn;
          auVar26[10] = in_XMM1_Bo;
          auVar26[0xb] = in_XMM1_Bp;
          auVar22[1] = in_XMM1_Bg;
          auVar22[0] = in_XMM1_Bf;
          auVar22[2] = in_XMM1_Bh;
          auVar22[3] = in_XMM1_Bi;
          auVar22[4] = in_XMM1_Bj;
          auVar22[5] = in_XMM1_Bk;
          auVar22[6] = in_XMM1_Bl;
          auVar22[7] = in_XMM1_Bm;
          auVar22[8] = in_XMM1_Bn;
          auVar22[9] = in_XMM1_Bo;
          auVar22[10] = in_XMM1_Bp;
          uVar41 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB141(auVar34 >> 7,0) & 1) << 2 |
                            (ushort)(SUB131(auVar30 >> 7,0) & 1) << 3 |
                            (ushort)(SUB121(auVar26 >> 7,0) & 1) << 4 |
                            (ushort)(SUB111(auVar22 >> 7,0) & 1) << 5 |
                            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                     CONCAT18(in_XMM1_Bo,
                                                              CONCAT17(in_XMM1_Bn,
                                                                       CONCAT16(in_XMM1_Bm,
                                                                                CONCAT15(in_XMM1_Bl,
                                                                                         CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                     CONCAT17(in_XMM1_Bo,
                                                              CONCAT16(in_XMM1_Bn,
                                                                       CONCAT15(in_XMM1_Bm,
                                                                                CONCAT14(in_XMM1_Bl,
                                                                                         CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                           7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
          uVar8 = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          psVar42 = psVar42 + uVar8;
          cVar2 = pcVar43[uVar8];
          pcVar43 = pcVar43 + uVar8;
        }
      } while (pcVar43 != pcVar6 + sVar37);
    }
    cs_impl::any::recycle(&aStack_c8);
  }
  peVar4 = (local_a0->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  pcVar6 = (peVar4->m_reflect).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .ctrl_;
  psVar42 = (peVar4->m_reflect).
            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            .
            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            .slots_;
  cVar2 = *pcVar6;
  pcVar43 = pcVar6;
  while (cVar2 < -1) {
    iVar17 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar18 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar19 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar20 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar43 < (char)iVar17);
    in_XMM1_Bb = -(pcVar43[1] < (char)((uint)iVar17 >> 8));
    in_XMM1_Bc = -(pcVar43[2] < (char)((uint)iVar17 >> 0x10));
    in_XMM1_Bd = -(pcVar43[3] < (char)((uint)iVar17 >> 0x18));
    in_XMM1_Be = -(pcVar43[4] < (char)iVar18);
    in_XMM1_Bf = -(pcVar43[5] < (char)((uint)iVar18 >> 8));
    in_XMM1_Bg = -(pcVar43[6] < (char)((uint)iVar18 >> 0x10));
    in_XMM1_Bh = -(pcVar43[7] < (char)((uint)iVar18 >> 0x18));
    in_XMM1_Bi = -(pcVar43[8] < (char)iVar19);
    in_XMM1_Bj = -(pcVar43[9] < (char)((uint)iVar19 >> 8));
    in_XMM1_Bk = -(pcVar43[10] < (char)((uint)iVar19 >> 0x10));
    in_XMM1_Bl = -(pcVar43[0xb] < (char)((uint)iVar19 >> 0x18));
    in_XMM1_Bm = -(pcVar43[0xc] < (char)iVar20);
    in_XMM1_Bn = -(pcVar43[0xd] < (char)((uint)iVar20 >> 8));
    in_XMM1_Bo = -(pcVar43[0xe] < (char)((uint)iVar20 >> 0x10));
    in_XMM1_Bp = -(pcVar43[0xf] < (char)((uint)iVar20 >> 0x18));
    auVar13[1] = in_XMM1_Bb;
    auVar13[0] = in_XMM1_Ba;
    auVar13[2] = in_XMM1_Bc;
    auVar13[3] = in_XMM1_Bd;
    auVar13[4] = in_XMM1_Be;
    auVar13[5] = in_XMM1_Bf;
    auVar13[6] = in_XMM1_Bg;
    auVar13[7] = in_XMM1_Bh;
    auVar13[8] = in_XMM1_Bi;
    auVar13[9] = in_XMM1_Bj;
    auVar13[10] = in_XMM1_Bk;
    auVar13[0xb] = in_XMM1_Bl;
    auVar13[0xc] = in_XMM1_Bm;
    auVar13[0xd] = in_XMM1_Bn;
    auVar13[0xe] = in_XMM1_Bo;
    auVar13[0xf] = in_XMM1_Bp;
    auVar14[1] = in_XMM1_Bb;
    auVar14[0] = in_XMM1_Ba;
    auVar14[2] = in_XMM1_Bc;
    auVar14[3] = in_XMM1_Bd;
    auVar14[4] = in_XMM1_Be;
    auVar14[5] = in_XMM1_Bf;
    auVar14[6] = in_XMM1_Bg;
    auVar14[7] = in_XMM1_Bh;
    auVar14[8] = in_XMM1_Bi;
    auVar14[9] = in_XMM1_Bj;
    auVar14[10] = in_XMM1_Bk;
    auVar14[0xb] = in_XMM1_Bl;
    auVar14[0xc] = in_XMM1_Bm;
    auVar14[0xd] = in_XMM1_Bn;
    auVar14[0xe] = in_XMM1_Bo;
    auVar14[0xf] = in_XMM1_Bp;
    auVar35[1] = in_XMM1_Bd;
    auVar35[0] = in_XMM1_Bc;
    auVar35[2] = in_XMM1_Be;
    auVar35[3] = in_XMM1_Bf;
    auVar35[4] = in_XMM1_Bg;
    auVar35[5] = in_XMM1_Bh;
    auVar35[6] = in_XMM1_Bi;
    auVar35[7] = in_XMM1_Bj;
    auVar35[8] = in_XMM1_Bk;
    auVar35[9] = in_XMM1_Bl;
    auVar35[10] = in_XMM1_Bm;
    auVar35[0xb] = in_XMM1_Bn;
    auVar35[0xc] = in_XMM1_Bo;
    auVar35[0xd] = in_XMM1_Bp;
    auVar31[1] = in_XMM1_Be;
    auVar31[0] = in_XMM1_Bd;
    auVar31[2] = in_XMM1_Bf;
    auVar31[3] = in_XMM1_Bg;
    auVar31[4] = in_XMM1_Bh;
    auVar31[5] = in_XMM1_Bi;
    auVar31[6] = in_XMM1_Bj;
    auVar31[7] = in_XMM1_Bk;
    auVar31[8] = in_XMM1_Bl;
    auVar31[9] = in_XMM1_Bm;
    auVar31[10] = in_XMM1_Bn;
    auVar31[0xb] = in_XMM1_Bo;
    auVar31[0xc] = in_XMM1_Bp;
    auVar27[1] = in_XMM1_Bf;
    auVar27[0] = in_XMM1_Be;
    auVar27[2] = in_XMM1_Bg;
    auVar27[3] = in_XMM1_Bh;
    auVar27[4] = in_XMM1_Bi;
    auVar27[5] = in_XMM1_Bj;
    auVar27[6] = in_XMM1_Bk;
    auVar27[7] = in_XMM1_Bl;
    auVar27[8] = in_XMM1_Bm;
    auVar27[9] = in_XMM1_Bn;
    auVar27[10] = in_XMM1_Bo;
    auVar27[0xb] = in_XMM1_Bp;
    auVar23[1] = in_XMM1_Bg;
    auVar23[0] = in_XMM1_Bf;
    auVar23[2] = in_XMM1_Bh;
    auVar23[3] = in_XMM1_Bi;
    auVar23[4] = in_XMM1_Bj;
    auVar23[5] = in_XMM1_Bk;
    auVar23[6] = in_XMM1_Bl;
    auVar23[7] = in_XMM1_Bm;
    auVar23[8] = in_XMM1_Bn;
    auVar23[9] = in_XMM1_Bo;
    auVar23[10] = in_XMM1_Bp;
    uVar41 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar35 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar31 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar27 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar23 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar8 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    psVar42 = psVar42 + uVar8;
    cVar2 = pcVar43[uVar8];
    pcVar43 = pcVar43 + uVar8;
  }
  sVar37 = (peVar4->m_reflect).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .capacity_;
  if (pcVar43 != pcVar6 + sVar37) {
    do {
      sVar40 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
               ::count<std::__cxx11::string>
                         ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                           *)(__p->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,&(psVar42->value).first);
      if (sVar40 == 0) {
        pdVar5 = (__p->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_90.mDat =
             (((local_a0->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
             _M_impl.super__Vector_impl_data._M_start[(long)(&psVar42->key)[1]._M_dataplus._M_p].
             mDat;
        if (local_90.mDat != (proxy *)0x0) {
          (local_90.mDat)->refcount = (local_90.mDat)->refcount + 1;
        }
        copy((EVP_PKEY_CTX *)&local_c0,(EVP_PKEY_CTX *)&local_90);
        domain_type::add_var(pdVar5,&(psVar42->value).first,(var *)&local_c0);
        cs_impl::any::recycle((any *)&local_c0);
        cs_impl::any::recycle(&local_90);
      }
      psVar42 = (slot_type *)&(&psVar42->key)[1]._M_string_length;
      cVar2 = pcVar43[1];
      pcVar43 = pcVar43 + 1;
      while (cVar2 < -1) {
        iVar17 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar18 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar19 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar20 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar43 < (char)iVar17);
        in_XMM1_Bb = -(pcVar43[1] < (char)((uint)iVar17 >> 8));
        in_XMM1_Bc = -(pcVar43[2] < (char)((uint)iVar17 >> 0x10));
        in_XMM1_Bd = -(pcVar43[3] < (char)((uint)iVar17 >> 0x18));
        in_XMM1_Be = -(pcVar43[4] < (char)iVar18);
        in_XMM1_Bf = -(pcVar43[5] < (char)((uint)iVar18 >> 8));
        in_XMM1_Bg = -(pcVar43[6] < (char)((uint)iVar18 >> 0x10));
        in_XMM1_Bh = -(pcVar43[7] < (char)((uint)iVar18 >> 0x18));
        in_XMM1_Bi = -(pcVar43[8] < (char)iVar19);
        in_XMM1_Bj = -(pcVar43[9] < (char)((uint)iVar19 >> 8));
        in_XMM1_Bk = -(pcVar43[10] < (char)((uint)iVar19 >> 0x10));
        in_XMM1_Bl = -(pcVar43[0xb] < (char)((uint)iVar19 >> 0x18));
        in_XMM1_Bm = -(pcVar43[0xc] < (char)iVar20);
        in_XMM1_Bn = -(pcVar43[0xd] < (char)((uint)iVar20 >> 8));
        in_XMM1_Bo = -(pcVar43[0xe] < (char)((uint)iVar20 >> 0x10));
        in_XMM1_Bp = -(pcVar43[0xf] < (char)((uint)iVar20 >> 0x18));
        auVar15[1] = in_XMM1_Bb;
        auVar15[0] = in_XMM1_Ba;
        auVar15[2] = in_XMM1_Bc;
        auVar15[3] = in_XMM1_Bd;
        auVar15[4] = in_XMM1_Be;
        auVar15[5] = in_XMM1_Bf;
        auVar15[6] = in_XMM1_Bg;
        auVar15[7] = in_XMM1_Bh;
        auVar15[8] = in_XMM1_Bi;
        auVar15[9] = in_XMM1_Bj;
        auVar15[10] = in_XMM1_Bk;
        auVar15[0xb] = in_XMM1_Bl;
        auVar15[0xc] = in_XMM1_Bm;
        auVar15[0xd] = in_XMM1_Bn;
        auVar15[0xe] = in_XMM1_Bo;
        auVar15[0xf] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Bb;
        auVar16[0] = in_XMM1_Ba;
        auVar16[2] = in_XMM1_Bc;
        auVar16[3] = in_XMM1_Bd;
        auVar16[4] = in_XMM1_Be;
        auVar16[5] = in_XMM1_Bf;
        auVar16[6] = in_XMM1_Bg;
        auVar16[7] = in_XMM1_Bh;
        auVar16[8] = in_XMM1_Bi;
        auVar16[9] = in_XMM1_Bj;
        auVar16[10] = in_XMM1_Bk;
        auVar16[0xb] = in_XMM1_Bl;
        auVar16[0xc] = in_XMM1_Bm;
        auVar16[0xd] = in_XMM1_Bn;
        auVar16[0xe] = in_XMM1_Bo;
        auVar16[0xf] = in_XMM1_Bp;
        auVar36[1] = in_XMM1_Bd;
        auVar36[0] = in_XMM1_Bc;
        auVar36[2] = in_XMM1_Be;
        auVar36[3] = in_XMM1_Bf;
        auVar36[4] = in_XMM1_Bg;
        auVar36[5] = in_XMM1_Bh;
        auVar36[6] = in_XMM1_Bi;
        auVar36[7] = in_XMM1_Bj;
        auVar36[8] = in_XMM1_Bk;
        auVar36[9] = in_XMM1_Bl;
        auVar36[10] = in_XMM1_Bm;
        auVar36[0xb] = in_XMM1_Bn;
        auVar36[0xc] = in_XMM1_Bo;
        auVar36[0xd] = in_XMM1_Bp;
        auVar32[1] = in_XMM1_Be;
        auVar32[0] = in_XMM1_Bd;
        auVar32[2] = in_XMM1_Bf;
        auVar32[3] = in_XMM1_Bg;
        auVar32[4] = in_XMM1_Bh;
        auVar32[5] = in_XMM1_Bi;
        auVar32[6] = in_XMM1_Bj;
        auVar32[7] = in_XMM1_Bk;
        auVar32[8] = in_XMM1_Bl;
        auVar32[9] = in_XMM1_Bm;
        auVar32[10] = in_XMM1_Bn;
        auVar32[0xb] = in_XMM1_Bo;
        auVar32[0xc] = in_XMM1_Bp;
        auVar28[1] = in_XMM1_Bf;
        auVar28[0] = in_XMM1_Be;
        auVar28[2] = in_XMM1_Bg;
        auVar28[3] = in_XMM1_Bh;
        auVar28[4] = in_XMM1_Bi;
        auVar28[5] = in_XMM1_Bj;
        auVar28[6] = in_XMM1_Bk;
        auVar28[7] = in_XMM1_Bl;
        auVar28[8] = in_XMM1_Bm;
        auVar28[9] = in_XMM1_Bn;
        auVar28[10] = in_XMM1_Bo;
        auVar28[0xb] = in_XMM1_Bp;
        auVar24[1] = in_XMM1_Bg;
        auVar24[0] = in_XMM1_Bf;
        auVar24[2] = in_XMM1_Bh;
        auVar24[3] = in_XMM1_Bi;
        auVar24[4] = in_XMM1_Bj;
        auVar24[5] = in_XMM1_Bk;
        auVar24[6] = in_XMM1_Bl;
        auVar24[7] = in_XMM1_Bm;
        auVar24[8] = in_XMM1_Bn;
        auVar24[9] = in_XMM1_Bo;
        auVar24[10] = in_XMM1_Bp;
        uVar41 = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar36 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar32 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar28 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar24 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar8 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        psVar42 = psVar42 + uVar8;
        cVar2 = pcVar43[uVar8];
        pcVar43 = pcVar43 + uVar8;
      }
    } while (pcVar43 != pcVar6 + sVar37);
  }
  peVar4 = (__p->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"duplicate","");
  sVar37 = phmap::priv::
           raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
           ::count<std::__cxx11::string>
                     ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                       *)peVar4,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (sVar37 != 0) {
    pdVar5 = (__p->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"duplicate","");
    pvVar38 = domain_type::get_var(pdVar5,&local_c0);
    local_38 = local_60;
    cs_impl::any::make<cs::structure,cs::structure*>(&aStack_c8,&local_38);
    local_40 = local_a0;
    cs_impl::any::make<cs::structure,cs::structure_const*>(&local_98,&local_40);
    invoke<cs_impl::any,cs_impl::any>((cs *)&local_50,pvVar38,&aStack_c8,&local_98);
    cs_impl::any::recycle(&local_50);
    cs_impl::any::recycle(&local_98);
    cs_impl::any::recycle(&aStack_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

structure(const structure &s) : m_id(s.m_id), m_name(s.m_name),
			m_data(std::make_shared<domain_type>())
		{
			if (s.m_data->exist("parent")) {
				var &_p = s.m_data->get_var("parent");
				auto &_parent = _p.val<structure>();
				var p = copy(_p);
				auto &parent = p.val<structure>();
				m_data->add_var("parent", p);
				for (auto &it: *parent.m_data) {
					// Handle overriding
					const var &v = s.m_data->get_var(it.first);
					if (!_parent.m_data->get_var(it.first).is_same(v))
						m_data->add_var(it.first, copy(v));
					else
						m_data->add_var(it.first, parent.m_data->get_var_by_id(it.second));
				}
			}
			for (auto &it: *s.m_data)
				if (!m_data->exist(it.first))
					m_data->add_var(it.first, copy(s.m_data->get_var_by_id(it.second)));
			if (m_data->exist("duplicate"))
				invoke(m_data->get_var("duplicate"), var::make<structure>(this), var::make<structure>(&s));
		}